

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int libyuv::ARGBSobelize
              (uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height,_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelRow)

{
  uint8_t *puVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  void *__ptr;
  uint8_t *puVar6;
  code *pcVar7;
  uint uVar8;
  code *pcVar9;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  int local_b0;
  uint8_t *local_a8;
  uint8_t *local_68;
  ulong uVar10;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_argb == (uint8_t *)0x0)) {
    iVar3 = -1;
  }
  else {
    local_b0 = src_stride_argb;
    local_a8 = src_argb;
    if (height < 0) {
      local_a8 = src_argb + ~height * src_stride_argb;
      local_b0 = -src_stride_argb;
      height = -height;
    }
    iVar3 = TestCpuFlag(0x40);
    if ((width & 0xfU) == 0) {
      pcVar9 = ARGBToYJRow_SSSE3;
    }
    else {
      pcVar9 = ARGBToYJRow_Any_SSSE3;
    }
    if (iVar3 == 0) {
      pcVar9 = ARGBToYJRow_C;
    }
    iVar3 = TestCpuFlag(0x400);
    if ((width & 0x1fU) == 0) {
      pcVar7 = ARGBToYJRow_AVX2;
    }
    else {
      pcVar7 = ARGBToYJRow_Any_AVX2;
    }
    if (iVar3 == 0) {
      pcVar7 = pcVar9;
    }
    iVar3 = TestCpuFlag(0x20);
    if (iVar3 == 0) {
      pcVar9 = SobelYRow_C;
    }
    else {
      pcVar9 = SobelYRow_SSE2;
    }
    iVar3 = TestCpuFlag(0x20);
    if (iVar3 == 0) {
      pcVar5 = SobelXRow_C;
    }
    else {
      pcVar5 = SobelXRow_SSE2;
    }
    uVar8 = width + 0x2fU & 0x7fffffe0;
    uVar10 = (ulong)uVar8;
    uVar13 = (ulong)(uVar8 * 2);
    __ptr = malloc((ulong)(uVar8 * 5 + 0x5f));
    puVar6 = (uint8_t *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    puVar11 = puVar6 + uVar13 + 0x10;
    puVar1 = puVar6 + uVar10 + 0x10 + uVar13;
    (*pcVar7)(local_a8,puVar11,width);
    puVar11[-1] = *puVar11;
    uVar2 = (ulong)(uint)width;
    uVar12 = (ulong)(width - 1);
    auVar17 = ZEXT216(CONCAT11(puVar6[uVar12 + 0x10 + uVar13],puVar6[uVar12 + 0x10 + uVar13]));
    auVar17 = pshuflw(auVar17,auVar17,0);
    uVar16 = auVar17._0_4_;
    puVar15 = puVar6 + uVar2 + 0x10 + uVar13;
    *(undefined4 *)puVar15 = uVar16;
    *(undefined4 *)(puVar15 + 4) = uVar16;
    *(undefined4 *)(puVar15 + 8) = uVar16;
    *(undefined4 *)(puVar15 + 0xc) = uVar16;
    (*pcVar7)(local_a8,puVar1);
    puVar6[uVar10 + 0xf + uVar13] = puVar6[uVar10 + 0x10 + uVar13];
    auVar17 = ZEXT216(CONCAT11(puVar1[uVar12],puVar1[uVar12]));
    auVar17 = pshuflw(auVar17,auVar17,0);
    uVar16 = auVar17._0_4_;
    puVar15 = puVar1 + uVar2;
    *(undefined4 *)puVar15 = uVar16;
    *(undefined4 *)(puVar15 + 4) = uVar16;
    *(undefined4 *)(puVar15 + 8) = uVar16;
    *(undefined4 *)(puVar15 + 0xc) = uVar16;
    *(undefined1 (*) [16])(puVar1 + uVar10 + uVar2) = (undefined1  [16])0x0;
    puVar15 = puVar1 + uVar10;
    local_68 = dst_argb;
    for (iVar3 = 0; puVar14 = puVar11, puVar11 = puVar1, height != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = 0;
      if (iVar3 < height + -1) {
        iVar4 = local_b0;
      }
      local_a8 = local_a8 + iVar4;
      (*pcVar7)(local_a8,puVar15,width);
      puVar15[-1] = *puVar15;
      puVar15[uVar2] = puVar15[uVar12];
      puVar1 = puVar14 + -1;
      (*pcVar5)(puVar1,puVar11 + -1,puVar15 + -1,puVar6,width);
      (*pcVar9)(puVar1,puVar15 + -1,puVar6 + uVar10,width);
      (*SobelRow)(puVar6,puVar6 + uVar10,local_68,width);
      local_68 = local_68 + dst_stride_argb;
      puVar1 = puVar15;
      puVar15 = puVar14;
    }
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int ARGBSobelize(const uint8_t* src_argb,
                        int src_stride_argb,
                        uint8_t* dst_argb,
                        int dst_stride_argb,
                        int width,
                        int height,
                        void (*SobelRow)(const uint8_t* src_sobelx,
                                         const uint8_t* src_sobely,
                                         uint8_t* dst,
                                         int width)) {
  int y;
  void (*ARGBToYJRow)(const uint8_t* src_argb, uint8_t* dst_g, int width) =
      ARGBToYJRow_C;
  void (*SobelYRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    uint8_t* dst_sobely, int width) = SobelYRow_C;
  void (*SobelXRow)(const uint8_t* src_y0, const uint8_t* src_y1,
                    const uint8_t* src_y2, uint8_t* dst_sobely, int width) =
      SobelXRow_C;
  const int kEdge = 16;  // Extra pixels at start of row for extrude/align.
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }

#if defined(HAS_ARGBTOYJROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBToYJRow = ARGBToYJRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBToYJRow = ARGBToYJRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      ARGBToYJRow = ARGBToYJRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBToYJRow = ARGBToYJRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBToYJRow = ARGBToYJRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      ARGBToYJRow = ARGBToYJRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBTOYJROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBToYJRow = ARGBToYJRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      ARGBToYJRow = ARGBToYJRow_MSA;
    }
  }
#endif

#if defined(HAS_SOBELYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelYRow = SobelYRow_SSE2;
  }
#endif
#if defined(HAS_SOBELYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelYRow = SobelYRow_NEON;
  }
#endif
#if defined(HAS_SOBELYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelYRow = SobelYRow_MMI;
  }
#endif
#if defined(HAS_SOBELYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelYRow = SobelYRow_MSA;
  }
#endif
#if defined(HAS_SOBELXROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelXRow = SobelXRow_SSE2;
  }
#endif
#if defined(HAS_SOBELXROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelXRow = SobelXRow_NEON;
  }
#endif
#if defined(HAS_SOBELXROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelXRow = SobelXRow_MMI;
  }
#endif
#if defined(HAS_SOBELXROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelXRow = SobelXRow_MSA;
  }
#endif
  {
    // 3 rows with edges before/after.
    const int kRowSize = (width + kEdge + 31) & ~31;
    align_buffer_64(rows, kRowSize * 2 + (kEdge + kRowSize * 3 + kEdge));
    uint8_t* row_sobelx = rows;
    uint8_t* row_sobely = rows + kRowSize;
    uint8_t* row_y = rows + kRowSize * 2;

    // Convert first row.
    uint8_t* row_y0 = row_y + kEdge;
    uint8_t* row_y1 = row_y0 + kRowSize;
    uint8_t* row_y2 = row_y1 + kRowSize;
    ARGBToYJRow(src_argb, row_y0, width);
    row_y0[-1] = row_y0[0];
    memset(row_y0 + width, row_y0[width - 1], 16);  // Extrude 16 for valgrind.
    ARGBToYJRow(src_argb, row_y1, width);
    row_y1[-1] = row_y1[0];
    memset(row_y1 + width, row_y1[width - 1], 16);
    memset(row_y2 + width, 0, 16);

    for (y = 0; y < height; ++y) {
      // Convert next row of ARGB to G.
      if (y < (height - 1)) {
        src_argb += src_stride_argb;
      }
      ARGBToYJRow(src_argb, row_y2, width);
      row_y2[-1] = row_y2[0];
      row_y2[width] = row_y2[width - 1];

      SobelXRow(row_y0 - 1, row_y1 - 1, row_y2 - 1, row_sobelx, width);
      SobelYRow(row_y0 - 1, row_y2 - 1, row_sobely, width);
      SobelRow(row_sobelx, row_sobely, dst_argb, width);

      // Cycle thru circular queue of 3 row_y buffers.
      {
        uint8_t* row_yt = row_y0;
        row_y0 = row_y1;
        row_y1 = row_y2;
        row_y2 = row_yt;
      }

      dst_argb += dst_stride_argb;
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}